

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderVertexSpacing::verifyEdges
          (TessellationShaderVertexSpacing *this,_tess_edges *edges,_run *run)

{
  _tessellation_shader_vertex_spacing _Var1;
  pointer p_Var2;
  TessellationShaderVertexSpacing *pTVar3;
  uint uVar4;
  _tess_coordinate_delta *p_Var5;
  TestError *pTVar6;
  _tessellation_shader_vertex_spacing vertex_spacing;
  pointer p_Var7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float edge_clamped_rounded_tess_level;
  float outermost_edge_tess_level_clamped_rounded;
  string vertex_spacing_string;
  string primitive_mode_string;
  float edge_clamped_tess_level;
  _tess_coordinate_delta new_item;
  float local_224;
  TessellationShaderVertexSpacing *local_220;
  _tess_coordinate_delta *local_218;
  iterator iStack_210;
  _tess_coordinate_delta *local_208;
  float local_1fc;
  string local_1f8;
  string local_1d8;
  float local_1b8;
  float local_1b4;
  undefined1 local_1b0 [8];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_220 = this;
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            (&local_1d8,(TessellationShaderUtils *)(ulong)run->primitive_mode,
             (_tessellation_primitive_mode)run);
  TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
            (&local_1f8,(TessellationShaderUtils *)(ulong)run->vertex_spacing,vertex_spacing);
  p_Var7 = (edges->
           super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (p_Var7 != (edges->
                super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    uVar8 = 0;
    do {
      pTVar3 = local_220;
      local_1b4 = 0.0;
      local_224 = 0.0;
      local_1fc = 0.0;
      local_218 = (_tess_coordinate_delta *)0x0;
      iStack_210._M_current = (_tess_coordinate_delta *)0x0;
      local_208 = (_tess_coordinate_delta *)0x0;
      TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
                (run->vertex_spacing,p_Var7->outermost_tess_level,
                 local_220->m_gl_max_tess_gen_level_value,(float *)0x0,&local_1fc);
      TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
                (run->vertex_spacing,p_Var7->tess_level,pTVar3->m_gl_max_tess_gen_level_value,
                 &local_1b4,&local_224);
      uVar4 = (uint)((ulong)((long)(p_Var7->points).
                                   super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(p_Var7->points).
                                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (1 < uVar4) {
        uVar4 = uVar4 - 1;
        if (uVar4 != 0) {
          uVar9 = 0;
          do {
            p_Var2 = (p_Var7->points).
                     super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            fVar10 = p_Var2[uVar9].x - p_Var2[uVar9 + 1].x;
            fVar11 = p_Var2[uVar9].y - p_Var2[uVar9 + 1].y;
            fVar10 = fVar10 * fVar10 + fVar11 * fVar11;
            if (fVar10 < 0.0) {
              fVar10 = sqrtf(fVar10);
              p_Var5 = local_218;
            }
            else {
              fVar10 = SQRT(fVar10);
              p_Var5 = local_218;
            }
            for (; p_Var5 != iStack_210._M_current; p_Var5 = p_Var5 + 1) {
              fVar12 = p_Var5->delta - fVar10;
              fVar11 = -fVar12;
              if (-fVar12 <= fVar12) {
                fVar11 = fVar12;
              }
              if (fVar11 < 0.001) {
                p_Var5->counter = p_Var5->counter + 1;
                break;
              }
            }
            if (p_Var5 == iStack_210._M_current) {
              local_1b0._4_4_ = fVar10;
              local_1b0._0_4_ = 1;
              if (iStack_210._M_current == local_208) {
                std::
                vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>>
                ::
                _M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta_const&>
                          ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>>
                            *)&local_218,iStack_210,(_tess_coordinate_delta *)local_1b0);
              }
              else {
                (iStack_210._M_current)->counter = 1;
                (iStack_210._M_current)->delta = fVar10;
                iStack_210._M_current = iStack_210._M_current + 1;
              }
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar4);
        }
        _Var1 = run->vertex_spacing;
        if (_Var1 - TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN < 2) {
          if (0x10 < (ulong)((long)iStack_210._M_current - (long)local_218)) {
            local_1b0 = (undefined1  [8])
                        ((local_220->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                        m_log;
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"More than two segment deltas (",0x1e);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       ") were generated for the following tessellation configuration: primitive mode:"
                       ,0x4e);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"vertex spacing mode:",0x14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"inner tessellation levels: (",0x1c);
            std::ostream::_M_insert<double>((double)run->inner[0]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->inner[1]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"), outer tessellation levels: (",0x1f);
            std::ostream::_M_insert<double>((double)run->outer[0]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->outer[1]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->outer[2]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->outer[3]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            std::ios_base::~ios_base(local_138);
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,
                       "Fractional spacing mode tessellated edges to segments of more than two differentiable lengths"
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                       ,0x4fc);
            goto LAB_00ccf6c5;
          }
          if ((long)iStack_210._M_current - (long)local_218 == 8) {
            if (run->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) {
              uVar4 = (int)local_1fc - ((uint)(uVar8 * 0xaaaaaaab >> 0x20) & 0xfffffffe);
            }
            else {
              uVar4 = (uint)(uVar8 >> 1) & 0x7ffffffe;
              if (_Var1 != TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD ||
                  run->primitive_mode != TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS) {
                uVar4 = 0;
              }
              if (p_Var7->tess_level <= 0.0) {
                uVar4 = 1;
              }
              else {
                uVar4 = (int)local_224 - uVar4;
              }
            }
            if (local_218->counter != uVar4) {
              local_1b0 = (undefined1  [8])
                          ((local_220->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)
                          ->m_log;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Invalid amount of segments (expected:",0x25);
              std::ostream::operator<<(local_1a8,uVar4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", found: ",9)
              ;
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         ") was generated for the following tessellation configuration: primitive mode:"
                         ,0x4d);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"vertex spacing mode:",0x14);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"inner tessellation levels: (",0x1c);
              std::ostream::_M_insert<double>((double)run->inner[0]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::_M_insert<double>((double)run->inner[1]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"), outer tessellation levels: (",0x1f);
              std::ostream::_M_insert<double>((double)run->outer[0]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::_M_insert<double>((double)run->outer[1]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::_M_insert<double>((double)run->outer[2]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::_M_insert<double>((double)run->outer[3]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar6,
                         "Invalid amount of segments generated for fractional vertex spacing mode",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                         ,0x528);
              __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
          }
          else {
            uVar4 = local_218->counter;
            if (((uVar4 != 2) || (local_218[1].counter != (int)(long)local_224 - 2U)) &&
               ((local_218[1].counter != 2 || (uVar4 != (int)(long)local_224 - 2U)))) {
              local_1b0 = (undefined1  [8])
                          ((local_220->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)
                          ->m_log;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Invalid number of segments with different deltas (",
                         0x32);
              std::ostream::_M_insert<double>((double)local_218->delta);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," and ",5);
              std::ostream::_M_insert<double>((double)local_218[1].delta);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,") was generated. primitive mode:",0x20);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"vertex spacing mode:",0x14);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"inner tessellation levels: (",0x1c);
              std::ostream::_M_insert<double>((double)run->inner[0]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::_M_insert<double>((double)run->inner[1]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"), outer tessellation levels: (",0x1f);
              std::ostream::_M_insert<double>((double)run->outer[0]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::_M_insert<double>((double)run->outer[1]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::_M_insert<double>((double)run->outer[2]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::_M_insert<double>((double)run->outer[3]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar6,
                         "Equal amount of segments was generated for segments of different deltas",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                         ,0x53f);
LAB_00ccf6c5:
              __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            if ((uVar4 != 2) && (local_218[1].counter != 2)) {
              local_1b0 = (undefined1  [8])
                          ((local_220->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)
                          ->m_log;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Neither of the segments generated by the tessellator was defined exactly twice.primitive mode:"
                         ,0x5e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"vertex spacing mode:",0x14);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"inner tessellation levels: (",0x1c);
              std::ostream::_M_insert<double>((double)run->inner[0]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::_M_insert<double>((double)run->inner[1]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"), outer tessellation levels: (",0x1f);
              std::ostream::_M_insert<double>((double)run->outer[0]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::_M_insert<double>((double)run->outer[1]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::_M_insert<double>((double)run->outer[2]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              std::ostream::_M_insert<double>((double)run->outer[3]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar6,
                         "Neither of the generated segments was repeated exactly twice for fractional vertex spacing mode"
                         ,(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                         ,0x550);
              goto LAB_00ccf6c5;
            }
          }
        }
        else {
          if ((_Var1 != TESSELLATION_SHADER_VERTEX_SPACING_EQUAL) &&
             (_Var1 != TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT)) {
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,"Unrecognized vertex spacing mode",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                       ,0x559);
            goto LAB_00ccf6c5;
          }
          if ((long)iStack_210._M_current - (long)local_218 != 8) {
            local_1b0 = (undefined1  [8])
                        ((local_220->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                        m_log;
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "More than one segment delta was generated for the following tessellation configuration: primitive mode:"
                       ,0x67);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"vertex spacing mode:",0x14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"inner tessellation levels: (",0x1c);
            std::ostream::_M_insert<double>((double)run->inner[0]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->inner[1]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"), outer tessellation levels: (",0x1f);
            std::ostream::_M_insert<double>((double)run->outer[0]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->outer[1]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->outer[2]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->outer[3]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            std::ios_base::~ios_base(local_138);
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,
                       "Equal vertex spacing mode tessellation generated segment edges of varying lengths, whereas only one was expected."
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                       ,0x4b2);
LAB_00ccf45f:
            __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          fVar12 = p_Var7->edge_length / local_224;
          fVar11 = local_218->delta - fVar12;
          fVar10 = -fVar11;
          if (-fVar11 <= fVar11) {
            fVar10 = fVar11;
          }
          if (0.001 < fVar10) {
            local_1b0 = (undefined1  [8])
                        ((local_220->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                        m_log;
            local_1b8 = fVar12;
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Invalid segment delta (expected:",0x20);
            std::ostream::_M_insert<double>((double)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", found: ",9);
            std::ostream::_M_insert<double>((double)local_218->delta);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       ") was generated for the following tessellation configuration: primitive mode:"
                       ,0x4d);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"vertex spacing mode:",0x14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"inner tessellation levels: (",0x1c);
            std::ostream::_M_insert<double>((double)run->inner[0]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->inner[1]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"), outer tessellation levels: (",0x1f);
            std::ostream::_M_insert<double>((double)run->outer[0]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->outer[1]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->outer[2]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->outer[3]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            std::ios_base::~ios_base(local_138);
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,
                       "Invalid delta between segments generated by the tessellator configured to run in equal vertex spacing mode"
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                       ,0x4c3);
            goto LAB_00ccf45f;
          }
          if (local_218->counter != (uint)(long)local_224) {
            local_1b0 = (undefined1  [8])
                        ((local_220->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                        m_log;
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Invalid amount of segments (expected:",0x25);
            std::ostream::operator<<(local_1a8,(int)local_224);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", found: ",9);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       ") was generated for the following tessellation configuration: primitive mode:"
                       ,0x4d);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"vertex spacing mode:",0x14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"inner tessellation levels: (",0x1c);
            std::ostream::_M_insert<double>((double)run->inner[0]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->inner[1]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"), outer tessellation levels: (",0x1f);
            std::ostream::_M_insert<double>((double)run->outer[0]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->outer[1]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->outer[2]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            std::ostream::_M_insert<double>((double)run->outer[3]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            std::ios_base::~ios_base(local_138);
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,"Invalid amount of segments generated for equal vertex spacing mode",
                       (char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                       ,0x4d5);
            goto LAB_00ccf45f;
          }
        }
      }
      if (local_218 != (_tess_coordinate_delta *)0x0) {
        operator_delete(local_218,(long)local_208 - (long)local_218);
      }
      p_Var7 = p_Var7 + 1;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (p_Var7 != (edges->
                       super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TessellationShaderVertexSpacing::verifyEdges(const _tess_edges& edges, const _run& run)
{
	/* Cache strings that may be used by logging the routines */
	const std::string primitive_mode_string = TessellationShaderUtils::getESTokenForPrimitiveMode(run.primitive_mode);
	const std::string vertex_spacing_string =
		TessellationShaderUtils::getESTokenForVertexSpacingMode(run.vertex_spacing);

	/* Iterate through all edges */
	unsigned int n_edge = 0;

	for (_tess_edges_const_iterator edges_iterator = edges.begin(); edges_iterator != edges.end();
		 edges_iterator++, n_edge++)
	{
		const _tess_edge&		edge									  = *edges_iterator;
		float					edge_clamped_tess_level					  = 0.0f;
		float					edge_clamped_rounded_tess_level			  = 0.0f;
		float					outermost_edge_tess_level_clamped_rounded = 0.0f;
		_tess_coordinate_deltas segment_deltas;

		TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
			run.vertex_spacing, edge.outermost_tess_level, m_gl_max_tess_gen_level_value, DE_NULL, /* out_clamped */
			&outermost_edge_tess_level_clamped_rounded);

		/* Retrieve amount of segments the edge should consist of */
		TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
			run.vertex_spacing, edge.tess_level, m_gl_max_tess_gen_level_value, &edge_clamped_tess_level,
			&edge_clamped_rounded_tess_level);

		/* Take two subsequent points if they are available. Vertex spacing has no meaning
		 * in a world of degenerate edges, so skip the check if we have just encountered one.
		 */
		const unsigned int n_points = (const unsigned int)edge.points.size();

		if (n_points < 2)
		{
			continue;
		}

		/* Compute segment deltas */
		for (unsigned int n_base_point = 0; n_base_point < n_points - 1; n_base_point++)
		{
			const _tess_coordinate_cartesian& point_a = edge.points[n_base_point + 0];
			const _tess_coordinate_cartesian& point_b = edge.points[n_base_point + 1];

			/* Calculate the distance between the points */
			float distance_nonsqrt = 0.0f;
			float distance		   = 0.0f;

			distance_nonsqrt =
				(point_a.x - point_b.x) * (point_a.x - point_b.x) + (point_a.y - point_b.y) * (point_a.y - point_b.y);

			distance = deFloatSqrt(distance_nonsqrt);

			/* Check if the distance is not already recognized. */
			_tess_coordinate_deltas_iterator deltas_iterator;

			for (deltas_iterator = segment_deltas.begin(); deltas_iterator != segment_deltas.end(); deltas_iterator++)
			{
				if (de::abs(deltas_iterator->delta - distance) < epsilon)
				{
					/* Increment the counter and leave */
					deltas_iterator->counter++;

					break;
				}
			}

			if (deltas_iterator == segment_deltas.end())
			{
				/* This is the first time we're encountering a segment of this specific length. */
				_tess_coordinate_delta new_item;

				new_item.counter = 1;
				new_item.delta   = distance;

				segment_deltas.push_back(new_item);
			}
		} /* for (all base points) */

		DE_ASSERT(segment_deltas.size() != 0);

		switch (run.vertex_spacing)
		{
		case TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT:
		case TESSELLATION_SHADER_VERTEX_SPACING_EQUAL:
		{
			/* For equal vertex spacings, we should end up with a single _tess_coordinate_delta instance
			 * of a predefined length, describing exactly edge_clamped_rounded_tess_level invocations */
			float expected_delta = edge.edge_length / edge_clamped_rounded_tess_level;

			if (segment_deltas.size() != 1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << "More than one segment delta was generated for the following tessellation"
									  " configuration: "
									  "primitive mode:"
								   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
								   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
								   << ")"
									  ", outer tessellation levels: ("
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

				TCU_FAIL("Equal vertex spacing mode tessellation generated segment edges of varying lengths, "
						 "whereas only one was expected.");
			}

			if (de::abs(segment_deltas[0].delta - expected_delta) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid segment delta (expected:" << expected_delta
								   << ", found: " << segment_deltas[0].delta
								   << ") was generated for the following tessellation configuration: "
									  "primitive mode:"
								   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
								   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
								   << ")"
									  ", outer tessellation levels: ("
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid delta between segments generated by the tessellator configured to run "
						 "in equal vertex spacing mode");
			}

			if (segment_deltas[0].counter != (unsigned int)edge_clamped_rounded_tess_level)
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << "Invalid amount of segments (expected:" << (int)edge_clamped_rounded_tess_level
								   << ", found: " << segment_deltas[0].counter
								   << ") "
									  "was generated for the following tessellation configuration: "
									  "primitive mode:"
								   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
								   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
								   << ")"
									  ", outer tessellation levels: ("
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid amount of segments generated for equal vertex spacing mode");
			}

			break;
		} /* default/equal vertex spacing */

		case TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN:
		case TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD:
		{
			/* For fractional vertex spacings, situation is more tricky. The extension specification
			 * is very liberal when it comes to defining segment lengths. Hence the only thing we
			 * should be testing here is that:
			 *
			 * a) No more than 2 deltas are generated for a single edge.
			 *
			 * b) If a single delta is generated, it should:
			 *
			 *    1. define exactly edge_clamped_rounded_tess_level-2 segments if
			 *    |edge_clamped_rounded_tess_level - edge_clamped_tess_level| == 2.0f,
			 *
			 *    2. define exactly edge_clamped_rounded_tess_level segments otherwise.
			 *
			 * c) If two deltas are generated, one of them should define 2 segments, and the other
			 *    one should define edge_clamped_rounded_tess_level-2 segments.
			 */

			if (segment_deltas.size() > 2)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "More than two segment deltas (" << segment_deltas.size()
								   << ") were generated for the following tessellation configuration: "
									  "primitive mode:"
								   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
								   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
								   << ")"
									  ", outer tessellation levels: ("
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

				TCU_FAIL("Fractional spacing mode tessellated edges to segments of more than two "
						 "differentiable lengths");
			}

			if (segment_deltas.size() == 1)
			{
				int expected_counter = 0;

				if (run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
				{
					/* With each triangle level, 2 segments go out. Each triangle consists of 3 edges */
					expected_counter = (int)outermost_edge_tess_level_clamped_rounded - 2 * (n_edge / 3);
				}
				else
				{
					expected_counter = (int)edge_clamped_rounded_tess_level;
					if (run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS &&
						run.vertex_spacing == TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD)
					{
						/* 8 edges expected in total; we should expect 2 segments less for the inner quad */
						expected_counter = (int)edge_clamped_rounded_tess_level - 2 * (n_edge / 4);
					}

					/* For degenerate cases, always assume exactly one segment should be generated */
					if (edge.tess_level <= 0.0f)
					{
						expected_counter = 1;
					}
				}

				if (segment_deltas[0].counter != (unsigned int)expected_counter)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid amount of segments (expected:" << expected_counter
									   << ", found: " << segment_deltas[0].counter
									   << ") "
										  "was generated for the following tessellation configuration: "
										  "primitive mode:"
									   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
									   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
									   << ")"
										  ", outer tessellation levels: ("
									   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
									   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

					TCU_FAIL("Invalid amount of segments generated for fractional vertex spacing mode");
				}
			}
			else
			{
				DE_ASSERT(segment_deltas.size() == 2);

				if (!((segment_deltas[0].counter == 2 &&
					   segment_deltas[1].counter == ((unsigned int)edge_clamped_rounded_tess_level - 2)) ||
					  (segment_deltas[1].counter == 2 &&
					   segment_deltas[0].counter == ((unsigned int)edge_clamped_rounded_tess_level - 2))))
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid number of segments with different deltas ("
									   << segment_deltas[0].delta << " and " << segment_deltas[1].delta
									   << ") was generated. "
										  "primitive mode:"
									   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
									   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
									   << ")"
										  ", outer tessellation levels: ("
									   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
									   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

					TCU_FAIL("Equal amount of segments was generated for segments of different deltas");
				}

				if (segment_deltas[0].counter != 2 && segment_deltas[1].counter != 2)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Neither of the segments generated by the tessellator was defined "
										  "exactly twice."
										  "primitive mode:"
									   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
									   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
									   << ")"
										  ", outer tessellation levels: ("
									   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
									   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

					TCU_FAIL("Neither of the generated segments was repeated exactly twice "
							 "for fractional vertex spacing mode");
				}
			}

			break;
		} /* fractional even/odd vertex spacing types */

		default:
		{
			TCU_FAIL("Unrecognized vertex spacing mode");
		}
		} /* switch (run.vertex_spacing) */
	}	 /* for (all edges) */
}